

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ExpressionResultBuilder::ExprComponents::ExprComponents(ExprComponents *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  return;
}

Assistant:

ExprComponents() : shouldNegate( false ) {}